

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O1

void __thiscall TimeTest_LocalTime_Test::TestBody(TimeTest_LocalTime_Test *this)

{
  int iVar1;
  tm *ptVar2;
  format_error *this_00;
  char *in_R9;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AssertionResult gtest_ar_;
  time_t t;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_88 [12];
  int iStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_78;
  int iStack_68;
  int iStack_64;
  int local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_20;
  
  local_20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)time((time_t *)0x0);
  ptVar2 = localtime((time_t *)&local_20);
  local_38._0_4_ = ptVar2->tm_sec;
  local_38._4_4_ = ptVar2->tm_min;
  uStack_30._0_4_ = ptVar2->tm_hour;
  uStack_30._4_4_ = ptVar2->tm_mday;
  local_48._0_4_ = ptVar2->tm_mon;
  local_48._4_4_ = ptVar2->tm_year;
  uStack_40._0_4_ = ptVar2->tm_wday;
  uStack_40._4_4_ = ptVar2->tm_yday;
  iVar1 = ptVar2->tm_isdst;
  local_88._0_8_ = local_20;
  ptVar2 = localtime_r((time_t *)local_88,(tm *)(local_88 + 8));
  if (ptVar2 != (tm *)0x0) {
    auVar5._0_4_ = -(uint)((int)local_38 == local_88._8_4_);
    auVar5._4_4_ = -(uint)(local_38._4_4_ == iStack_7c);
    auVar5._8_4_ = -(uint)((int)uStack_30 == aStack_78._M_allocated_capacity._0_4_);
    auVar5._12_4_ = -(uint)(uStack_30._4_4_ == aStack_78._M_allocated_capacity._4_4_);
    auVar6._0_4_ = -(uint)((int)local_48 == aStack_78._8_4_);
    auVar6._4_4_ = -(uint)(local_48._4_4_ == aStack_78._12_4_);
    auVar6._8_4_ = -(uint)((int)uStack_40 == iStack_68);
    auVar6._12_4_ = -(uint)(uStack_40._4_4_ == iStack_64);
    auVar5 = packssdw(auVar5,auVar6);
    auVar5 = packsswb(auVar5,auVar5);
    bVar3 = (byte)(SUB161(auVar5 >> 7,0) & 1 | (SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar5 >> 0x17,0) & 1) << 2 | (SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar5 >> 0x27,0) & 1) << 4 | (SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar5 >> 0x37,0) & 1) << 6 | SUB161(auVar5 >> 0x3f,0) << 7) == 0xff;
    bVar4 = iVar1 == local_60;
    local_98[0] = (internal)(bVar4 && bVar3);
    local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar4 || !bVar3) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,local_98,(AssertionResult *)"EqualTime(tm, fmt::localtime(t))",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/time-test.cc"
                 ,0x3d,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._0_8_ != &aStack_78) {
        operator_delete((void *)local_88._0_8_);
      }
      if (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_a8.ptr_ + 8))();
        }
        local_a8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  fmt::v5::format_error::format_error(this_00,"time_t value out of range");
  __cxa_throw(this_00,&fmt::v5::format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(TimeTest, LocalTime) {
  std::time_t t = std::time(FMT_NULL);
  std::tm tm = *std::localtime(&t);
  EXPECT_TRUE(EqualTime(tm, fmt::localtime(t)));
}